

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

int VP8EncWrite(VP8Encoder *enc)

{
  WebPPicture *pic_00;
  int iVar1;
  int iVar2;
  VP8BitWriter *bw_00;
  size_t sVar3;
  ulong uVar4;
  WebPPicture *pic_01;
  undefined1 *puVar5;
  VP8Encoder *enc_00;
  VP8Encoder *in_RDI;
  size_t size;
  uint8_t *buf;
  size_t size0;
  uint8_t *part0;
  uint32_t padded_alpha_size;
  int p;
  size_t riff_size;
  size_t pad;
  size_t vp8_size;
  int ok;
  int final_percent;
  int percent_per_part;
  int task_percent;
  VP8BitWriter *bw;
  WebPPicture *pic;
  uint in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8c;
  byte in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  bool bVar6;
  byte bVar7;
  WebPPicture *in_stack_ffffffffffffff90;
  WebPPicture *in_stack_ffffffffffffff98;
  int local_4c;
  VP8Encoder *in_stack_ffffffffffffffb8;
  VP8Encoder *enc_01;
  uint local_30;
  uint local_4;
  
  pic_00 = in_RDI->pic_;
  bw_00 = &in_RDI->bw_;
  iVar1 = GeneratePartition0(in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    sVar3 = VP8BitWriterSize(bw_00);
    uVar4 = sVar3 + 10 + (long)((in_RDI->num_parts_ + -1) * 3);
    for (local_4c = 0; local_4c < in_RDI->num_parts_; local_4c = local_4c + 1) {
      sVar3 = VP8BitWriterSize(in_RDI->parts_ + local_4c);
      uVar4 = sVar3 + uVar4;
    }
    pic_01 = (WebPPicture *)(uVar4 & 1);
    enc_01 = (VP8Encoder *)((long)pic_01->pad1 + (uVar4 - 0x3c));
    puVar5 = (undefined1 *)((long)&enc_01->pic_ + 4);
    iVar2 = IsVP8XNeeded(in_RDI);
    if (iVar2 != 0) {
      puVar5 = puVar5 + 0x12;
    }
    if (in_RDI->has_alpha_ != 0) {
      puVar5 = puVar5 + (in_RDI->alpha_data_size_ + (in_RDI->alpha_data_size_ & 1) + 8);
    }
    if (puVar5 < (undefined1 *)0xffffffff) {
      enc_00 = (VP8Encoder *)VP8BitWriterBuf(bw_00);
      sVar3 = VP8BitWriterSize(bw_00);
      bVar6 = false;
      if (iVar1 != 0) {
        iVar1 = PutWebPHeaders(enc_00,sVar3,(size_t)in_stack_ffffffffffffff98,
                               (size_t)in_stack_ffffffffffffff90);
        bVar6 = false;
        if (iVar1 != 0) {
          iVar1 = (*pic_00->writer)((uint8_t *)enc_00,sVar3,pic_00);
          bVar6 = false;
          if (iVar1 != 0) {
            iVar1 = EmitPartitionsSize(enc_01,pic_01);
            bVar6 = iVar1 != 0;
          }
        }
      }
      bVar7 = bVar6;
      VP8BitWriterWipeOut((VP8BitWriter *)0x17be0d);
      for (local_4c = 0; iVar1 = (int)puVar5, local_30 = (uint)bVar6, local_4c < in_RDI->num_parts_;
          local_4c = local_4c + 1) {
        in_stack_ffffffffffffff98 = (WebPPicture *)VP8BitWriterBuf(in_RDI->parts_ + local_4c);
        in_stack_ffffffffffffff90 = (WebPPicture *)VP8BitWriterSize(in_RDI->parts_ + local_4c);
        if (in_stack_ffffffffffffff90 != (WebPPicture *)0x0) {
          in_stack_ffffffffffffff8e = false;
          if (local_30 != 0) {
            iVar1 = (*pic_00->writer)((uint8_t *)in_stack_ffffffffffffff98,
                                      (size_t)in_stack_ffffffffffffff90,pic_00);
            in_stack_ffffffffffffff8e = iVar1 != 0;
          }
          local_30 = (uint)(byte)in_stack_ffffffffffffff8e;
        }
        VP8BitWriterWipeOut((VP8BitWriter *)0x17bec5);
        in_stack_ffffffffffffff8d = false;
        if (local_30 != 0) {
          iVar1 = WebPReportProgress(in_stack_ffffffffffffff98,
                                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                     (int *)CONCAT17(bVar7,CONCAT16(in_stack_ffffffffffffff8e,
                                                                    (uint6)CONCAT14(
                                                  in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88))));
          in_stack_ffffffffffffff8d = iVar1 != 0;
        }
        bVar6 = (bool)in_stack_ffffffffffffff8d;
      }
      if ((local_30 != 0) && (pic_01 != (WebPPicture *)0x0)) {
        local_30 = PutPaddingByte(in_stack_ffffffffffffff90);
      }
      in_RDI->coded_size_ = iVar1 + 8;
      bVar6 = false;
      if (local_30 != 0) {
        iVar1 = WebPReportProgress(in_stack_ffffffffffffff98,
                                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                   (int *)CONCAT17(bVar7,CONCAT16(in_stack_ffffffffffffff8e,
                                                                  CONCAT15(in_stack_ffffffffffffff8d
                                                                           ,(uint5)
                                                  in_stack_ffffffffffffff88))));
        bVar6 = iVar1 != 0;
      }
      local_4 = (uint)bVar6;
    }
    else {
      local_4 = WebPEncodingSetError(pic_00,VP8_ENC_ERROR_FILE_TOO_BIG);
    }
  }
  return local_4;
}

Assistant:

int VP8EncWrite(VP8Encoder* const enc) {
  WebPPicture* const pic = enc->pic_;
  VP8BitWriter* const bw = &enc->bw_;
  const int task_percent = 19;
  const int percent_per_part = task_percent / enc->num_parts_;
  const int final_percent = enc->percent_ + task_percent;
  int ok = 0;
  size_t vp8_size, pad, riff_size;
  int p;

  // Partition #0 with header and partition sizes
  ok = GeneratePartition0(enc);
  if (!ok) return 0;

  // Compute VP8 size
  vp8_size = VP8_FRAME_HEADER_SIZE +
             VP8BitWriterSize(bw) +
             3 * (enc->num_parts_ - 1);
  for (p = 0; p < enc->num_parts_; ++p) {
    vp8_size += VP8BitWriterSize(enc->parts_ + p);
  }
  pad = vp8_size & 1;
  vp8_size += pad;

  // Compute RIFF size
  // At the minimum it is: "WEBPVP8 nnnn" + VP8 data size.
  riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8_size;
  if (IsVP8XNeeded(enc)) {  // Add size for: VP8X header + data.
    riff_size += CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE;
  }
  if (enc->has_alpha_) {  // Add size for: ALPH header + data.
    const uint32_t padded_alpha_size = enc->alpha_data_size_ +
                                       (enc->alpha_data_size_ & 1);
    riff_size += CHUNK_HEADER_SIZE + padded_alpha_size;
  }
  // RIFF size should fit in 32-bits.
  if (riff_size > 0xfffffffeU) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_FILE_TOO_BIG);
  }

  // Emit headers and partition #0
  {
    const uint8_t* const part0 = VP8BitWriterBuf(bw);
    const size_t size0 = VP8BitWriterSize(bw);
    ok = ok && PutWebPHeaders(enc, size0, vp8_size, riff_size)
            && pic->writer(part0, size0, pic)
            && EmitPartitionsSize(enc, pic);
    VP8BitWriterWipeOut(bw);    // will free the internal buffer.
  }

  // Token partitions
  for (p = 0; p < enc->num_parts_; ++p) {
    const uint8_t* const buf = VP8BitWriterBuf(enc->parts_ + p);
    const size_t size = VP8BitWriterSize(enc->parts_ + p);
    if (size) ok = ok && pic->writer(buf, size, pic);
    VP8BitWriterWipeOut(enc->parts_ + p);    // will free the internal buffer.
    ok = ok && WebPReportProgress(pic, enc->percent_ + percent_per_part,
                                  &enc->percent_);
  }

  // Padding byte
  if (ok && pad) {
    ok = PutPaddingByte(pic);
  }

  enc->coded_size_ = (int)(CHUNK_HEADER_SIZE + riff_size);
  ok = ok && WebPReportProgress(pic, final_percent, &enc->percent_);
  return ok;
}